

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O3

void __thiscall asmjit::ConstPool::fill(ConstPool *this,void *dst)

{
  uint uVar1;
  Node *pNVar2;
  ulong uVar3;
  long lVar4;
  byte *pbVar5;
  size_t *extraout_RDX;
  Node *pNVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node *__src;
  ulong uVar9;
  undefined8 *__dest;
  byte *pbVar10;
  ulong uVar11;
  ulong *puVar12;
  long lVar13;
  size_t __n;
  Node *pNVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  CpuInfo CStack_320;
  void *pvStack_288;
  undefined8 *puStack_280;
  Node *pNStack_278;
  size_t *psStack_270;
  undefined1 auStack_268 [24];
  long lStack_250;
  long lStack_248;
  Tree *pTStack_240;
  size_t sStack_238;
  Node *pNStack_230;
  ulong local_228 [63];
  
  lVar4 = 0;
  __src = (Node *)0x0;
  pNStack_230 = (Node *)0x116be5;
  __dest = (undefined8 *)dst;
  memset(dst,0,this->_size);
  __n = 1;
  while (pNVar8 = this->_tree[lVar4]._tree._root, pNVar8 == (Node *)0x0) {
LAB_00116c46:
    __n = __n * 2;
    lVar4 = lVar4 + 1;
    if (lVar4 == 6) {
      return;
    }
  }
  lVar13 = 0;
  while( true ) {
    while (pNVar2 = (Node *)((pNVar8->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                             super_ZoneTreeNode._rbNodeData[0] & 0xfffffffffffffffe),
          pNVar2 == (Node *)0x0) {
      while( true ) {
        if ((pNVar8->field_0x10 & 1) == 0) {
          __dest = (undefined8 *)((ulong)pNVar8->_offset + (long)dst);
          __src = pNVar8 + 1;
          pNStack_230 = (Node *)0x116c37;
          memcpy(__dest,__src,__n);
        }
        pNVar8 = (Node *)(pNVar8->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode.
                         _rbNodeData[1];
        if (pNVar8 != (Node *)0x0) break;
        bVar15 = lVar13 == 0;
        lVar13 = lVar13 + -1;
        if (bVar15) goto LAB_00116c46;
        pNVar8 = (Node *)local_228[lVar13];
      }
    }
    if (lVar13 == 0x3e) break;
    local_228[lVar13] = (ulong)pNVar8;
    lVar13 = lVar13 + 1;
    pNVar8 = pNVar2;
  }
  pNStack_230 = (Node *)0x116c69;
  fill();
  pNStack_230 = pNVar8;
  sStack_238 = __n;
  pTStack_240 = this->_tree;
  lStack_248 = lVar13;
  lStack_250 = lVar4;
  auStack_268._16_8_ = dst;
  uVar11 = (__src->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode._rbNodeData[0];
  if (uVar11 < 2) {
    if ((__src->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode._rbNodeData[1] == 0
       ) {
      if (uVar11 == 0) {
        pNVar8 = (Node *)*__dest;
        if (pNVar8 == (Node *)0x0) {
          *__dest = __src;
        }
        else {
          pNVar2 = (Node *)auStack_268;
          auStack_268._0_8_ = 0;
          auStack_268._8_8_ = pNVar8;
          (__src->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode._rbNodeData[0] =
               1;
          pNStack_278 = __src + 1;
          uVar11 = 0;
          pNVar6 = (Node *)0x0;
          uVar9 = 0;
          pNVar14 = (Node *)0x0;
          puStack_280 = __dest;
          psStack_270 = extraout_RDX;
          while( true ) {
            uVar3 = uVar11;
            if (pNVar8 == (Node *)0x0) {
              (pNVar14->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode._rbNodeData
              [uVar3] = (ulong)((uint)(pNVar14->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                                      super_ZoneTreeNode._rbNodeData[uVar3] & 1) | (ulong)__src;
              pNVar7 = __src;
            }
            else {
              uVar11 = (pNVar8->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode.
                       _rbNodeData[0];
              pbVar5 = (byte *)(uVar11 & 0xfffffffffffffffe);
              pNVar7 = pNVar8;
              if ((((pbVar5 != (byte *)0x0) && ((*pbVar5 & 1) != 0)) &&
                  (pbVar10 = (byte *)(pNVar8->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                                     super_ZoneTreeNode._rbNodeData[1], pbVar10 != (byte *)0x0)) &&
                 ((*pbVar10 & 1) != 0)) {
                (pNVar8->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode.
                _rbNodeData[0] = uVar11 | 1;
                *pbVar5 = *pbVar5 & 0xfe;
                puVar12 = (ulong *)(pNVar8->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                                   super_ZoneTreeNode._rbNodeData[1];
                *puVar12 = *puVar12 & 0xfffffffffffffffe;
              }
            }
            if (((pNVar14 != (Node *)0x0) &&
                (((pNVar7->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode.
                  _rbNodeData[0] & 1) != 0)) &&
               (((pNVar14->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode.
                 _rbNodeData[0] & 1) != 0)) {
              bVar16 = pNVar6 == (Node *)(pNVar2->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                                         super_ZoneTreeNode._rbNodeData[1];
              bVar17 = uVar9 == 0;
              bVar15 = !bVar17;
              uVar11 = (pNVar6->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode.
                       _rbNodeData[bVar15];
              pbVar5 = (byte *)(uVar11 & 0xfffffffffffffffe);
              pbVar10 = (byte *)(*(ulong *)(pbVar5 + (ulong)bVar17 * 8) & 0xfffffffffffffffe);
              if (pNVar7 == (Node *)((pNVar14->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                                     super_ZoneTreeNode._rbNodeData[uVar9] & 0xfffffffffffffffe)) {
                puVar12 = (ulong *)(pbVar5 + (ulong)bVar17 * 8);
                uVar11 = (ulong)pbVar10 | (ulong)((uint)uVar11 & 1);
              }
              else {
                uVar9 = (ulong)((uint)bVar15 * 8);
                lVar4 = (ulong)bVar17 * 8;
                *(ulong *)(pbVar5 + lVar4) =
                     (ulong)((uint)*(ulong *)(pbVar5 + (ulong)bVar17 * 8) & 1) |
                     *(ulong *)(pbVar10 + uVar9) & 0xfffffffffffffffe;
                *(ulong *)(pbVar10 + uVar9) =
                     (ulong)((uint)*(undefined8 *)(pbVar10 + uVar9) & 1) | (ulong)pbVar5;
                *pbVar5 = *pbVar5 | 1;
                *pbVar10 = *pbVar10 & 0xfe;
                uVar11 = (ulong)((uint)*(undefined8 *)
                                        ((long)(pNVar6->super_ZoneTreeNodeT<asmjit::ConstPool::Node>
                                               ).super_ZoneTreeNode._rbNodeData + uVar9) & 1);
                *(ulong *)((long)(pNVar6->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                                 super_ZoneTreeNode._rbNodeData + uVar9) = uVar11 | (ulong)pbVar10;
                puVar12 = (ulong *)(pbVar10 + lVar4);
                uVar11 = *(ulong *)(pbVar10 + lVar4) & 0xfffffffffffffffe | uVar11;
                pbVar5 = pbVar10;
              }
              (pNVar6->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode._rbNodeData
              [bVar15] = uVar11;
              *puVar12 = (ulong)((uint)*puVar12 & 1) | (ulong)pNVar6;
              *(byte *)(pNVar6->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode.
                       _rbNodeData =
                   (byte)(pNVar6->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode.
                         _rbNodeData[0] | 1;
              *pbVar5 = *pbVar5 & 0xfe;
              (pNVar2->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).super_ZoneTreeNode._rbNodeData
              [bVar16] = (ulong)((uint)(pNVar2->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                                       super_ZoneTreeNode._rbNodeData[bVar16] & 1) | (ulong)pbVar5;
            }
            if (pNVar7 == __src) break;
            pvStack_288 = (void *)0x116e2e;
            uVar1 = memcmp(pNVar7 + 1,pNStack_278,*psStack_270);
            if (pNVar6 != (Node *)0x0) {
              pNVar2 = pNVar6;
            }
            pNVar8 = (Node *)((pNVar7->super_ZoneTreeNodeT<asmjit::ConstPool::Node>).
                              super_ZoneTreeNode._rbNodeData[uVar1 >> 0x1f] & 0xfffffffffffffffe);
            uVar11 = (ulong)(uVar1 >> 0x1f);
            pNVar6 = pNVar14;
            uVar9 = uVar3;
            pNVar14 = pNVar7;
          }
          *puStack_280 = auStack_268._8_8_;
          *(byte *)(((ZoneTreeNodeT<asmjit::ConstPool::Node> *)auStack_268._8_8_)->
                   super_ZoneTreeNode)._rbNodeData =
               (byte)(((ZoneTreeNodeT<asmjit::ConstPool::Node> *)auStack_268._8_8_)->
                     super_ZoneTreeNode)._rbNodeData[0] & 0xfe;
        }
        return;
      }
      goto LAB_00116e7c;
    }
  }
  else {
    pvStack_288 = (void *)0x116e77;
    ZoneTree<asmjit::ConstPool::Node>::insert<asmjit::ConstPool::Compare>();
  }
  pvStack_288 = (void *)0x116e7c;
  ZoneTree<asmjit::ConstPool::Node>::insert<asmjit::ConstPool::Compare>();
LAB_00116e7c:
  pvStack_288 = (void *)0x116e81;
  ZoneTree<asmjit::ConstPool::Node>::insert<asmjit::ConstPool::Compare>();
  if (cpuInfoInitialized == '\0') {
    pvStack_288 = dst;
    memset(&CStack_320,0,0x98);
    x86::detectCpu(&CStack_320);
    lVar4 = sysconf(0x54);
    CStack_320._hwThreadCount = 1;
    if (1 < lVar4) {
      CStack_320._hwThreadCount = (uint32_t)lVar4;
    }
    memcpy(cpuInfoGlobal,&CStack_320,0x98);
    cpuInfoInitialized = '\x01';
  }
  return;
}

Assistant:

void ConstPool::fill(void* dst) const noexcept {
  // Clears possible gaps, asmjit should never emit garbage to the output.
  memset(dst, 0, _size);

  ConstPoolFill filler(static_cast<uint8_t*>(dst), 1);
  for (size_t i = 0; i < ASMJIT_ARRAY_SIZE(_tree); i++) {
    _tree[i].forEach(filler);
    filler._dataSize <<= 1;
  }
}